

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_object.c
# Opt level: O3

void parse_object_should_not_parse_non_objects(void)

{
  assert_not_object("");
  assert_not_object("{");
  assert_not_object("}");
  assert_not_object("[\"hello\",{}]");
  assert_not_object("42");
  assert_not_object("3.14");
  assert_not_object("\"{}hello world!\n\"");
  return;
}

Assistant:

static void parse_object_should_not_parse_non_objects(void)
{
    assert_not_object("");
    assert_not_object("{");
    assert_not_object("}");
    assert_not_object("[\"hello\",{}]");
    assert_not_object("42");
    assert_not_object("3.14");
    assert_not_object("\"{}hello world!\n\"");
}